

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Bool startParsing(XML_Parser parser)

{
  XML_Bool XVar1;
  int iVar2;
  __pid_t _Var3;
  char *pcVar4;
  unsigned_long uVar5;
  timeval local_20;
  
  if (parser->m_hash_secret_salt == 0) {
    iVar2 = gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    if (iVar2 != 0) {
      __assert_fail("gettimeofday_res == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmexpat/lib/xmlparse.c"
                    ,0x30f,"unsigned long gather_time_entropy(void)");
    }
    _Var3 = getpid();
    uVar5 = ((_Var3 ^ local_20.tv_usec) << 0x3d) - (_Var3 ^ local_20.tv_usec);
    pcVar4 = getenv("EXPAT_ENTROPY_DEBUG");
    if (((pcVar4 != (char *)0x0) && (*pcVar4 == '1')) && (pcVar4[1] == '\0')) {
      fprintf(_stderr,"Entropy: %s --> 0x%0*lx (%lu bytes)\n","fallback(8)",0x10,uVar5,8);
    }
    parser->m_hash_secret_salt = uVar5;
  }
  if (parser->m_ns != '\0') {
    XVar1 = setContext(parser,"xml=http://www.w3.org/XML/1998/namespace");
    return XVar1;
  }
  return '\x01';
}

Assistant:

static XML_Bool  /* only valid for root parser */
startParsing(XML_Parser parser)
{
    /* hash functions must be initialized before setContext() is called */
    if (hash_secret_salt == 0)
      hash_secret_salt = generate_hash_secret_salt(parser);
    if (ns) {
      /* implicit context only set for root parser, since child
         parsers (i.e. external entity parsers) will inherit it
      */
      return setContext(parser, implicitContext);
    }
    return XML_TRUE;
}